

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<unsigned_short,char_const(&)[2]>
          (String *__return_storage_ptr__,kj *this,unsigned_short *params,char (*params_1) [2])

{
  unsigned_short *value;
  char (*value_00) [2];
  CappedArray<char,_8UL> local_40;
  CappedArray<char,_8UL> local_30;
  char (*local_20) [2];
  char (*params_local_1) [2];
  unsigned_short *params_local;
  
  local_20 = (char (*) [2])params;
  params_local_1 = (char (*) [2])this;
  params_local = (unsigned_short *)__return_storage_ptr__;
  value = fwd<unsigned_short>((NoInfer<unsigned_short> *)this);
  local_30 = toCharSequence<unsigned_short>(value);
  value_00 = ::const(local_20);
  local_40 = (CappedArray<char,_8UL>)toCharSequence<char_const(&)[2]>(value_00);
  _::concat<kj::CappedArray<char,8ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_30,&local_40,(ArrayPtr<const_char> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}